

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O1

int __thiscall
GrcFont::GetGlyphMetric(GrcFont *this,gid16 wGlyphID,GlyphMetric gmet,GdlObject *pgdlobj)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  gid16 wGlyphID_00;
  gid16 wGlyphID_01;
  gid16 wGlyphID_02;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  _Alloc_hider _Var10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint nAdvWid;
  int nLsb;
  vector<bool,_std::allocator<bool>_> vfOnCurve;
  vector<int,_std::allocator<int>_> vnEndPt;
  vector<int,_std::allocator<int>_> vnY;
  vector<int,_std::allocator<int>_> vnX;
  uint local_19c;
  uint local_198;
  uint local_194;
  vector<bool,_std::allocator<bool>_> local_190;
  vector<int,_std::allocator<int>_> local_168;
  vector<int,_std::allocator<int>_> local_148;
  vector<int,_std::allocator<int>_> local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (gmet == kgmetAdvHeight) {
    return 0;
  }
  if (gmet == kgmetDescent) {
    iVar4 = TtfUtil::FontDescent(this->m_pOs2);
    return iVar4;
  }
  if (gmet == kgmetAscent) {
    iVar4 = TtfUtil::FontAscent(this->m_pOs2);
    return iVar4;
  }
  uVar7 = (uint)wGlyphID;
  if ((gmet < kgmetAdvHeight) && ((0x103U >> (gmet & 0x1f) & 1) != 0)) {
    bVar3 = TtfUtil::HorMetrics(wGlyphID,this->m_pHmtx,this->m_cHmtx,this->m_pHhea,(int *)&local_194
                                ,&local_19c);
    if (bVar3) {
      if (gmet == kgmetLsb) {
        return local_194;
      }
      if (gmet == kgmetAdvWidth) {
        return local_19c;
      }
      goto LAB_0016540e;
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Unable to get horizontal metrics for glyph ","");
    GdlGlyphDefn::GlyphIDString_abi_cxx11_(&local_50,(GdlGlyphDefn *)(ulong)wGlyphID,wGlyphID_00);
    GrcErrorList::AddItem
              (&g_errorList,true,0x78,pgdlobj,(GrpLineAndFile *)0x0,&local_d0,&local_50,
               (string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    iVar4 = -0x80000000;
    _Var10._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
      return -0x80000000;
    }
  }
  else {
LAB_0016540e:
    bVar3 = TtfUtil::IsSpace(wGlyphID,this->m_pLoca,this->m_cLoca,this->m_pHead);
    if (!bVar3) {
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      iVar4 = GetGlyfPts(this,wGlyphID,&local_168,&local_128,&local_148,&local_190);
      if (iVar4 == 0) {
LAB_00165773:
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"Unable to get bounding box for glyph ","");
        GdlGlyphDefn::GlyphIDString_abi_cxx11_(&local_90,(GdlGlyphDefn *)(ulong)uVar7,wGlyphID_02);
        GrcErrorList::AddItem
                  (&g_errorList,false,0x79,pgdlobj,(GrpLineAndFile *)0x0,&local_110,&local_90,
                   (string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                   (string *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        iVar4 = -0x80000000;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        uVar9 = (uint)((ulong)((long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        if ((int)uVar9 < 1) {
          iVar5 = -0x80000000;
          iVar6 = 0x7fffffff;
          iVar4 = 0x7fffffff;
          iVar13 = -0x80000000;
        }
        else {
          iVar4 = 0x7fffffff;
          iVar13 = -0x80000000;
          uVar8 = 0;
          iVar5 = -0x80000000;
          iVar6 = 0x7fffffff;
          iVar11 = -1;
          do {
            iVar1 = *(int *)((long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + uVar8 * 4);
            if (iVar11 < iVar1 && iVar1 != iVar11 + 1) {
              lVar12 = (long)iVar11;
              do {
                iVar11 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar12 + 1];
                if (iVar11 <= iVar6) {
                  iVar6 = iVar11;
                }
                iVar2 = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar12 + 1];
                if (iVar2 <= iVar4) {
                  iVar4 = iVar2;
                }
                if (iVar5 <= iVar11) {
                  iVar5 = iVar11;
                }
                if (iVar13 <= iVar2) {
                  iVar13 = iVar2;
                }
                lVar12 = lVar12 + 1;
              } while (iVar1 != (int)lVar12);
            }
            uVar8 = uVar8 + 1;
            iVar11 = iVar1;
          } while (uVar8 != (uVar9 & 0x7fffffff));
        }
        switch(gmet) {
        case kgmetRsb:
          iVar6 = (iVar6 + local_19c) - (iVar5 + local_194);
        case kgmetBbLeft:
          iVar4 = iVar6;
          bVar3 = false;
          break;
        case kgmetBbBottom:
          bVar3 = false;
          break;
        case kgmetBbHeight:
          iVar13 = iVar13 - iVar4;
        case kgmetBbTop:
          iVar4 = iVar13;
          bVar3 = false;
          break;
        case kgmetBbWidth:
          iVar5 = iVar5 - iVar6;
        case kgmetBbRight:
          iVar4 = iVar5;
          bVar3 = false;
          break;
        default:
          bVar3 = true;
          iVar4 = iVar13;
        }
        local_198 = uVar7;
        if (bVar3) goto LAB_00165773;
      }
      if (local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        return iVar4;
      }
      uVar8 = (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage -
              (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      _Var10._M_p = (pointer)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
      goto LAB_001658a6;
    }
    if (gmet == kgmetRsb) {
      return local_19c;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Requesting bounding box metric for white space glyph ","");
    GdlGlyphDefn::GlyphIDString_abi_cxx11_(&local_70,(GdlGlyphDefn *)(ulong)wGlyphID,wGlyphID_01);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"; 0 will be used","");
    GrcErrorList::AddItem
              (&g_errorList,false,0x1fd,pgdlobj,(GrpLineAndFile *)0x0,&local_f0,&local_70,&local_b0,
               (string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    iVar4 = 0;
    local_d0.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
    _Var10._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
      return 0;
    }
  }
  uVar8 = local_d0.field_2._M_allocated_capacity + 1;
LAB_001658a6:
  operator_delete(_Var10._M_p,uVar8);
  return iVar4;
}

Assistant:

int GrcFont::GetGlyphMetric(gid16 wGlyphID, GlyphMetric gmet, GdlObject * pgdlobj)
{
	Assert(m_pFile);
	Assert(m_pLoca);
	Assert(m_pGlyf);
	Assert(m_pOs2);
	Assert(m_pHmtx);
	Assert(m_pHhea);

	switch(gmet)
	{
	case kgmetAscent:
		return TtfUtil::FontAscent(m_pOs2);
	case kgmetDescent:
		return TtfUtil::FontDescent(m_pOs2);
	case kgmetAdvHeight: // TODO AlanW (SharonC): eventually the vmtx table will be needed?
		return 0;
	default:
		break;	// fall through
	}

	unsigned int nAdvWid;
    int nLsb;
	if (gmet == kgmetAdvWidth || gmet == kgmetLsb || gmet == kgmetRsb)
	{
		if (!TtfUtil::HorMetrics(wGlyphID, m_pHmtx, m_cHmtx, m_pHhea, nLsb, nAdvWid))
		{
			g_errorList.AddError(120, pgdlobj, 
				"Unable to get horizontal metrics for glyph ", 
				GdlGlyphDefn::GlyphIDString(wGlyphID));
			return INT_MIN;
		}

		switch(gmet)
		{
		case kgmetAdvWidth:
			return nAdvWid;
		case kgmetLsb: // Review: should we return xMin instead?
			return nLsb;
		default:
		    break;
		// handle Rsb below
		}
	}

	if (TtfUtil::IsSpace(wGlyphID, m_pLoca, m_cLoca, m_pHead))
	{
		if (gmet == kgmetRsb)
			return nAdvWid; // for space. RSB same as adv width to agree with compiler

		g_errorList.AddWarning(509, pgdlobj, 
			"Requesting bounding box metric for white space glyph ", 
			GdlGlyphDefn::GlyphIDString(wGlyphID), 
			"; 0 will be used");
		return 0; // for space, all BB metrics are zero
	}

	// Find bounding box metrics.
	/*
	Normally would use TtfUtil::GlyfBox but attachment points alter the metrics as follows.
	Normally the min and max values stored for each glyph also reflect the visual
	appearance of the glyph. When attachment points are added the min and max values
	may increase but the appearance of the glyph (the black part) will not change since
	attachment points aren't visible. We want the metrics returned here to match the 
	appearance of the the glyph and not be the min and max values with attachment points.
	The GDL author will be familiar with former which is also more intuitive to use.
	The font could be adjusted so attachment points don't affect min and max values
	but that would add a step to the font production process and may produce
	unexpected side effects.
	The bounding box metrics returned from Windows (GetGlyphMetrics) disregard the
	min and max values for each glyph and match the visual appearance. Presumably this
	is related to the way the Windows rasterizer discards attachment points. This means
	the Graphite engine should obtain the same metrics as are returned here.
	Attachment points in this context are points that are alone on their own
	contour (or path), so they can easily be referenced by path number (GPath in GDL).
	*/

	std::vector<int> vnEndPt, vnX, vnY;
	std::vector<bool> vfOnCurve;

	int xMin = INT_MAX;
	int yMin = INT_MAX;
	int xMax = INT_MIN;
	int yMax = INT_MIN;

	if (GetGlyfPts(wGlyphID, &vnEndPt, &vnX, &vnY, &vfOnCurve))
	{
		int nFirstPt = 0;
		int nSecondPt = -1;	// so nFirstPt initialized to zero in loop below
		int cEndPoints = signed(vnEndPt.size());
		int i, j;
		for (i = 0; i < cEndPoints; i++)
		{
			nFirstPt = nSecondPt + 1;
			nSecondPt = vnEndPt[i];
			if (nSecondPt - nFirstPt) // throw out point on contour with single point
			{
				for (j = nFirstPt; j <= nSecondPt; j++)
				{
					xMin = Min(xMin, vnX[j]);
					yMin = Min(yMin, vnY[j]);
					xMax = Max(xMax, vnX[j]);
					yMax = Max(yMax, vnY[j]);
				}
			}
		}

		switch(gmet)
		{
		case kgmetBbTop:
			return yMax;
		case kgmetBbBottom:
			return yMin;
		case kgmetBbLeft:
			return xMin;
		case kgmetBbRight:
			return xMax;
		case kgmetBbWidth:
			return xMax - xMin;
		case kgmetBbHeight:
			return yMax - yMin;
		case kgmetRsb:
			return nAdvWid - nLsb - (xMax - xMin);
		default:
		    break;
		}
	}

	g_errorList.AddWarning(121, pgdlobj, 
		"Unable to get bounding box for glyph ", 
		GdlGlyphDefn::GlyphIDString(wGlyphID));
	return INT_MIN;
}